

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O2

int InitCCITTFax3(TIFF *tif)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int *piVar4;
  int iVar5;
  uint8_t *puVar6;
  char *fmt;
  undefined1 auVar7 [16];
  
  iVar5 = _TIFFMergeFields(tif,faxFields,5);
  if (iVar5 == 0) {
    fmt = "Merging common CCITT Fax codec-specific tags failed";
  }
  else {
    puVar6 = (uint8_t *)_TIFFmallocExt(tif,0xa0);
    tif->tif_data = puVar6;
    if (puVar6 != (uint8_t *)0x0) {
      _TIFFmemset(puVar6,0,0xa0);
      piVar4 = (int *)tif->tif_data;
      iVar5 = tif->tif_mode;
      *piVar4 = iVar5;
      uVar2 = (tif->tif_tagmethods).vsetfield;
      uVar3 = (tif->tif_tagmethods).vgetfield;
      (tif->tif_tagmethods).vgetfield = Fax3VGetField;
      auVar7._8_4_ = (int)uVar2;
      auVar7._0_8_ = uVar3;
      auVar7._12_4_ = (int)((ulong)uVar2 >> 0x20);
      *(undefined1 (*) [16])(piVar4 + 10) = auVar7;
      (tif->tif_tagmethods).vsetfield = Fax3VSetField;
      *(TIFFPrintMethod *)(piVar4 + 0xe) = (tif->tif_tagmethods).printdir;
      (tif->tif_tagmethods).printdir = Fax3PrintDir;
      piVar4[8] = 0;
      if (iVar5 == 0) {
        pbVar1 = (byte *)((long)&tif->tif_flags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      piVar4[0x18] = 0;
      piVar4[0x19] = 0;
      TIFFSetField(tif,0x10004,_TIFFFax3fillruns);
      puVar6 = tif->tif_data;
      puVar6[0x88] = '\0';
      puVar6[0x89] = '\0';
      puVar6[0x8a] = '\0';
      puVar6[0x8b] = '\0';
      puVar6[0x8c] = '\0';
      puVar6[0x8d] = '\0';
      puVar6[0x8e] = '\0';
      puVar6[0x8f] = '\0';
      tif->tif_fixuptags = Fax3FixupTags;
      tif->tif_setupdecode = Fax3SetupState;
      tif->tif_predecode = Fax3PreDecode;
      tif->tif_decoderow = Fax3Decode1D;
      tif->tif_decodestrip = Fax3Decode1D;
      tif->tif_decodetile = Fax3Decode1D;
      tif->tif_setupencode = Fax3SetupState;
      tif->tif_preencode = Fax3PreEncode;
      tif->tif_postencode = Fax3PostEncode;
      tif->tif_encoderow = Fax3Encode;
      tif->tif_encodestrip = Fax3Encode;
      tif->tif_encodetile = Fax3Encode;
      tif->tif_close = Fax3Close;
      tif->tif_cleanup = Fax3Cleanup;
      return 1;
    }
    fmt = "No space for state block";
  }
  TIFFErrorExtR(tif,"InitCCITTFax3",fmt);
  return 0;
}

Assistant:

static int InitCCITTFax3(TIFF *tif)
{
    static const char module[] = "InitCCITTFax3";
    Fax3BaseState *sp;

    /*
     * Merge codec-specific tag information.
     */
    if (!_TIFFMergeFields(tif, faxFields, TIFFArrayCount(faxFields)))
    {
        TIFFErrorExtR(tif, "InitCCITTFax3",
                      "Merging common CCITT Fax codec-specific tags failed");
        return 0;
    }

    /*
     * Allocate state block so tag methods have storage to record values.
     */
    tif->tif_data = (uint8_t *)_TIFFmallocExt(tif, sizeof(Fax3CodecState));

    if (tif->tif_data == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for state block");
        return (0);
    }
    _TIFFmemset(tif->tif_data, 0, sizeof(Fax3CodecState));

    sp = Fax3State(tif);
    sp->rw_mode = tif->tif_mode;

    /*
     * Override parent get/set field methods.
     */
    sp->vgetparent = tif->tif_tagmethods.vgetfield;
    tif->tif_tagmethods.vgetfield = Fax3VGetField; /* hook for codec tags */
    sp->vsetparent = tif->tif_tagmethods.vsetfield;
    tif->tif_tagmethods.vsetfield = Fax3VSetField; /* hook for codec tags */
    sp->printdir = tif->tif_tagmethods.printdir;
    tif->tif_tagmethods.printdir = Fax3PrintDir; /* hook for codec tags */
    sp->groupoptions = 0;

    if (sp->rw_mode == O_RDONLY) /* FIXME: improve for in place update */
        tif->tif_flags |= TIFF_NOBITREV; /* decoder does bit reversal */
    DecoderState(tif)->runs = NULL;
    TIFFSetField(tif, TIFFTAG_FAXFILLFUNC, _TIFFFax3fillruns);
    EncoderState(tif)->refline = NULL;

    /*
     * Install codec methods.
     */
    tif->tif_fixuptags = Fax3FixupTags;
    tif->tif_setupdecode = Fax3SetupState;
    tif->tif_predecode = Fax3PreDecode;
    tif->tif_decoderow = Fax3Decode1D;
    tif->tif_decodestrip = Fax3Decode1D;
    tif->tif_decodetile = Fax3Decode1D;
    tif->tif_setupencode = Fax3SetupState;
    tif->tif_preencode = Fax3PreEncode;
    tif->tif_postencode = Fax3PostEncode;
    tif->tif_encoderow = Fax3Encode;
    tif->tif_encodestrip = Fax3Encode;
    tif->tif_encodetile = Fax3Encode;
    tif->tif_close = Fax3Close;
    tif->tif_cleanup = Fax3Cleanup;

    return (1);
}